

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

size_t __thiscall std::hash<PPData::Peptide>::operator()(hash<PPData::Peptide> *this,Peptide *p)

{
  size_t sVar1;
  undefined8 *in_RSI;
  string *__s;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  allocator local_39;
  string local_38 [56];
  
  __s = (string *)*in_RSI;
  this_00 = (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RSI[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)__s,(ulong)this_00,&local_39);
  sVar1 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(this_00,__s);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return sVar1;
}

Assistant:

size_t operator()(const PPData::Peptide& p) const {
            return (hash<string>()(string(p.sequence, p.sequence_length)));
//            return CityHash32(p.sequence, p.sequence_length);
        }